

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashna::HashLen16(uint64_t u,uint64_t v,uint64_t mul)

{
  ulong uVar1;
  uint64_t b;
  uint64_t a;
  uint64_t mul_local;
  uint64_t v_local;
  uint64_t u_local;
  
  uVar1 = (u ^ v) * mul;
  uVar1 = (v ^ uVar1 >> 0x2f ^ uVar1) * mul;
  return mul * (uVar1 >> 0x2f ^ uVar1);
}

Assistant:

STATIC_INLINE uint64_t HashLen16(uint64_t u, uint64_t v, uint64_t mul) {
  // Murmur-inspired hashing.
  uint64_t a = (u ^ v) * mul;
  a ^= (a >> 47);
  uint64_t b = (v ^ a) * mul;
  b ^= (b >> 47);
  b *= mul;
  return b;
}